

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O3

TLASInstanceDesc __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::GetInstanceDesc
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,char *Name)

{
  __node_base_ptr p_Var1;
  _Hash_node_base *p_Var2;
  char (*in_RCX) [35];
  _Hash_node_base *p_Var3;
  char (*in_R8) [3];
  TLASInstanceDesc TVar4;
  string msg;
  string local_48;
  char *local_28;
  
  local_28 = Name;
  if ((Name == (char *)0x0) || (*Name == '\0')) {
    FormatString<char[26],char[35]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",in_RCX);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"GetInstanceDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0xf6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_48,Name,false);
  p_Var1 = std::
           _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_Instances)._M_h,
                      (local_48._M_string_length & 0x7fffffffffffffff) %
                      (this->m_Instances)._M_h._M_bucket_count,(key_type *)&local_48,
                      local_48._M_string_length & 0x7fffffffffffffff);
  if (p_Var1 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var1->_M_nxt;
  }
  if ((local_48._M_dataplus._M_p != (Char *)0x0) && ((long)local_48._M_string_length < 0)) {
    operator_delete__(local_48._M_dataplus._M_p);
  }
  if (p_Var3 == (_Hash_node_base *)0x0) {
    FormatString<char[47],char_const*,char[3]>
              (&local_48,(Diligent *)"Can\'t find instance with the specified name (\'",
               (char (*) [47])&local_28,(char **)0x763745,in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,local_48._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = (_Hash_node_base *)0xffffffffffffffff;
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var3[3]._M_nxt;
    p_Var3 = p_Var3[4]._M_nxt;
  }
  TVar4.pBLAS = (IBottomLevelAS *)p_Var3;
  TVar4._0_8_ = p_Var2;
  return TVar4;
}

Assistant:

GetInstanceDesc(const char* Name) const override final
    {
        VERIFY_EXPR(Name != nullptr && Name[0] != '\0');

        TLASInstanceDesc Result = {};

        auto Iter = this->m_Instances.find(Name);
        if (Iter != this->m_Instances.end())
        {
            const auto& Inst                   = Iter->second;
            Result.ContributionToHitGroupIndex = Inst.ContributionToHitGroupIndex;
            Result.InstanceIndex               = Inst.InstanceIndex;
            Result.pBLAS                       = Inst.pBLAS;
        }
        else
        {
            Result.ContributionToHitGroupIndex = INVALID_INDEX;
            Result.InstanceIndex               = INVALID_INDEX;
            LOG_ERROR_MESSAGE("Can't find instance with the specified name ('", Name, "')");
        }

        return Result;
    }